

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O0

bool libwebm::ParseVpxCodecPrivate(uint8_t *private_data,int32_t length,Vp9CodecFeatures *features)

{
  uint uVar1;
  int iVar2;
  uint *in_RDX;
  int in_ESI;
  long in_RDI;
  int priv_profile_2;
  int priv_profile_1;
  int i;
  int levels [14];
  int kNumLevels;
  int priv_level;
  int priv_profile;
  uint8_t length_byte;
  uint8_t id_byte;
  int offset;
  int kVpxFeatureLength;
  uint8_t kVp9ChromaSubsamplingId;
  uint8_t kVp9BitDepthId;
  uint8_t kVp9LevelId;
  uint8_t kVp9ProfileId;
  int kVpxCodecPrivateMinLength;
  int local_7c;
  uint local_78 [14];
  undefined4 local_40;
  uint local_3c;
  uint local_38;
  char local_32;
  char local_31;
  int local_30;
  undefined4 local_2c;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined4 local_24;
  uint *local_20;
  int local_14;
  long local_10;
  bool local_1;
  
  local_24 = 3;
  if (((in_RDI == 0) || (in_RDX == (uint *)0x0)) || (in_ESI < 3)) {
    local_1 = false;
  }
  else {
    local_25 = 1;
    local_26 = 2;
    local_27 = 3;
    local_28 = 4;
    local_2c = 1;
    local_30 = 0;
    *in_RDX = 0x7fffffff;
    in_RDX[1] = 0x7fffffff;
    in_RDX[2] = 0x7fffffff;
    in_RDX[3] = 0x7fffffff;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    do {
      local_31 = *(char *)(local_10 + local_30);
      iVar2 = local_30 + 2;
      local_32 = *(char *)(local_10 + (local_30 + 1));
      if (local_32 != '\x01') {
        return false;
      }
      if (local_31 == '\x01') {
        local_30 = local_30 + 3;
        local_38 = (uint)*(byte *)(local_10 + iVar2);
        if (3 < local_38) {
          return false;
        }
        if ((*local_20 != 0x7fffffff) && (*local_20 != local_38)) {
          return false;
        }
        *local_20 = local_38;
      }
      else if (local_31 == '\x02') {
        local_30 = local_30 + 3;
        local_3c = (uint)*(byte *)(local_10 + iVar2);
        local_40 = 0xe;
        memcpy(local_78,&DAT_00b71320,0x38);
        for (local_7c = 0; local_7c < 0xe; local_7c = local_7c + 1) {
          if (local_3c == local_78[local_7c]) {
            if ((local_20[1] != 0x7fffffff) && (local_20[1] != local_3c)) {
              return false;
            }
            local_20[1] = local_3c;
            break;
          }
        }
        if (local_20[1] == 0x7fffffff) {
          return false;
        }
      }
      else {
        if (local_31 == '\x03') {
          uVar1 = (uint)*(byte *)(local_10 + iVar2);
          if (((uVar1 != 8) && (uVar1 != 10)) && (uVar1 != 0xc)) {
            return false;
          }
          if ((local_20[2] != 0x7fffffff) && (local_20[2] != uVar1)) {
            return false;
          }
          local_20[2] = uVar1;
        }
        else {
          if (local_31 != '\x04') {
            return false;
          }
          uVar1 = (uint)*(byte *)(local_10 + iVar2);
          if (((uVar1 != 0) && (uVar1 != 1)) && ((uVar1 != 2 && (uVar1 != 3)))) {
            return false;
          }
          if ((local_20[3] != 0x7fffffff) && (local_20[3] != uVar1)) {
            return false;
          }
          local_20[3] = uVar1;
        }
        local_30 = local_30 + 3;
      }
    } while (local_30 + 3 <= local_14);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParseVpxCodecPrivate(const uint8_t* private_data, int32_t length,
                          Vp9CodecFeatures* features) {
  const int kVpxCodecPrivateMinLength = 3;
  if (!private_data || !features || length < kVpxCodecPrivateMinLength)
    return false;

  const uint8_t kVp9ProfileId = 1;
  const uint8_t kVp9LevelId = 2;
  const uint8_t kVp9BitDepthId = 3;
  const uint8_t kVp9ChromaSubsamplingId = 4;
  const int kVpxFeatureLength = 1;
  int offset = 0;

  // Set features to not set.
  features->profile = Vp9CodecFeatures::kValueNotPresent;
  features->level = Vp9CodecFeatures::kValueNotPresent;
  features->bit_depth = Vp9CodecFeatures::kValueNotPresent;
  features->chroma_subsampling = Vp9CodecFeatures::kValueNotPresent;
  do {
    const uint8_t id_byte = private_data[offset++];
    const uint8_t length_byte = private_data[offset++];
    if (length_byte != kVpxFeatureLength)
      return false;
    if (id_byte == kVp9ProfileId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile < 0 || priv_profile > 3)
        return false;
      if (features->profile != Vp9CodecFeatures::kValueNotPresent &&
          features->profile != priv_profile) {
        return false;
      }
      features->profile = priv_profile;
    } else if (id_byte == kVp9LevelId) {
      const int priv_level = static_cast<int>(private_data[offset++]);

      const int kNumLevels = 14;
      const int levels[kNumLevels] = {10, 11, 20, 21, 30, 31, 40,
                                      41, 50, 51, 52, 60, 61, 62};

      for (int i = 0; i < kNumLevels; ++i) {
        if (priv_level == levels[i]) {
          if (features->level != Vp9CodecFeatures::kValueNotPresent &&
              features->level != priv_level) {
            return false;
          }
          features->level = priv_level;
          break;
        }
      }
      if (features->level == Vp9CodecFeatures::kValueNotPresent)
        return false;
    } else if (id_byte == kVp9BitDepthId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 8 && priv_profile != 10 && priv_profile != 12)
        return false;
      if (features->bit_depth != Vp9CodecFeatures::kValueNotPresent &&
          features->bit_depth != priv_profile) {
        return false;
      }
      features->bit_depth = priv_profile;
    } else if (id_byte == kVp9ChromaSubsamplingId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 0 && priv_profile != 1 && priv_profile != 2 &&
          priv_profile != 3)
        return false;
      if (features->chroma_subsampling != Vp9CodecFeatures::kValueNotPresent &&
          features->chroma_subsampling != priv_profile) {
        return false;
      }
      features->chroma_subsampling = priv_profile;
    } else {
      // Invalid ID.
      return false;
    }
  } while (offset + kVpxCodecPrivateMinLength <= length);

  return true;
}